

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O0

path * Omega_h::vtk::piece_filename(path *__return_storage_ptr__,path *piecepath,I32 rank)

{
  __cxx11 local_50 [51];
  undefined1 local_1d;
  I32 local_1c;
  path *ppStack_18;
  I32 rank_local;
  path *piecepath_local;
  path *piece_filename;
  
  local_1d = 0;
  local_1c = rank;
  ppStack_18 = piecepath;
  piecepath_local = __return_storage_ptr__;
  filesystem::path::path(__return_storage_ptr__,piecepath);
  filesystem::path::operator+=(__return_storage_ptr__,'_');
  std::__cxx11::to_string(local_50,local_1c);
  filesystem::path::operator+=(__return_storage_ptr__,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  filesystem::path::operator+=(__return_storage_ptr__,".vtu");
  return __return_storage_ptr__;
}

Assistant:

static filesystem::path piece_filename(
    filesystem::path const& piecepath, I32 rank) {
  auto piece_filename = piecepath;
  piece_filename += '_';
  piece_filename += std::to_string(rank);
  piece_filename += ".vtu";
  return piece_filename;
}